

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20250127::debugging_internal::MaybeAppend(State *state,char *str)

{
  int iVar1;
  undefined1 in_AL;
  undefined1 extraout_AL;
  size_t length;
  
  if (-1 < *(int *)&(state->parse_state).field_0xc) {
    return (bool)in_AL;
  }
  for (length = 0; str[length] != '\0'; length = length + 1) {
  }
  if ((length != 0) && (*(int *)&(state->parse_state).field_0xc < 0)) {
    if (*str == '<') {
      iVar1 = (state->parse_state).out_cur_idx;
      if (((0 < (long)iVar1) && (iVar1 < state->out_end_idx)) &&
         (state->out[(long)iVar1 + -1] == '<')) {
        Append(state," ",1);
      }
    }
    iVar1 = (state->parse_state).out_cur_idx;
    if ((iVar1 < state->out_end_idx) && ((*str == 0x5f || ((byte)((*str & 0xdfU) + 0xbf) < 0x1a))))
    {
      (state->parse_state).prev_name_idx = iVar1;
      *(short *)&(state->parse_state).field_0xc = (short)length;
    }
    Append(state,str,length);
    return (bool)extraout_AL;
  }
  return (bool)in_AL;
}

Assistant:

static bool MaybeAppend(State *state, const char *const str) {
  if (state->parse_state.append) {
    size_t length = StrLen(str);
    MaybeAppendWithLength(state, str, length);
  }
  return true;
}